

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::UserDefinedIOCase
          (UserDefinedIOCase *this,Context *context,char *name,char *description,
          TessPrimitiveType primType,IOType ioType,VertexIOArraySize vertexIOArraySize,
          TessControlOutArraySize tessControlOutArraySize,char *referenceImagePath)

{
  allocator<char> local_31;
  IOType local_30;
  TessPrimitiveType local_2c;
  IOType ioType_local;
  TessPrimitiveType primType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  UserDefinedIOCase *this_local;
  
  local_30 = ioType;
  local_2c = primType;
  _ioType_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UserDefinedIOCase_032af028;
  this->m_primitiveType = local_2c;
  this->m_ioType = local_30;
  this->m_vertexIOArraySize = vertexIOArraySize;
  this->m_tessControlOutArraySize = tessControlOutArraySize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_referenceImagePath,referenceImagePath,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::vector<glu::StructType,_std::allocator<glu::StructType>_>::vector(&this->m_structTypes);
  std::
  vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ::vector(&this->m_tcsOutputs);
  std::
  vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ::vector(&this->m_tesInputs);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&this->m_program);
  return;
}

Assistant:

UserDefinedIOCase (Context& context, const char* name, const char* description, TessPrimitiveType primType, IOType ioType, VertexIOArraySize vertexIOArraySize, TessControlOutArraySize tessControlOutArraySize, const char* referenceImagePath)
		: TestCase					(context, name, description)
		, m_primitiveType			(primType)
		, m_ioType					(ioType)
		, m_vertexIOArraySize		(vertexIOArraySize)
		, m_tessControlOutArraySize	(tessControlOutArraySize)
		, m_referenceImagePath		(referenceImagePath)
	{
	}